

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<PClass_*,_unsigned_int,_THashTraits<PClass_*>,_TValueTraits<unsigned_int>_>::Resize
          (TMap<PClass_*,_unsigned_int,_THashTraits<PClass_*>,_TValueTraits<unsigned_int>_> *this,
          hash_t nhsize)

{
  uint uVar1;
  Node *block;
  Node *pNVar2;
  long lVar3;
  
  uVar1 = this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  if ((ulong)uVar1 != 0) {
    lVar3 = 0;
    do {
      if (*(long *)((long)&block->Next + lVar3) != 1) {
        pNVar2 = NewKey(this,*(PClass **)((long)&(block->Pair).Key + lVar3));
        (pNVar2->Pair).Value = *(uint *)((long)&(block->Pair).Value + lVar3);
      }
      lVar3 = lVar3 + 0x18;
    } while ((ulong)uVar1 * 0x18 != lVar3);
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}